

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

bool ImGui_ImplSDL2_ProcessEvent(SDL_Event *event)

{
  ImGuiKey IVar1;
  ImGui_ImplSDL2_Data *pIVar2;
  ImGuiIO *this;
  int *in_RDI;
  ImGuiIO *unaff_retaddr;
  bool in_stack_0000000b;
  int in_stack_0000000c;
  Uint8 window_event;
  ImGuiKey key;
  int mouse_button;
  float wheel_y;
  float wheel_x;
  ImVec2 mouse_pos;
  ImGuiIO *io;
  ImGui_ImplSDL2_Data *bd;
  uint local_44;
  SDL_Keymod in_stack_ffffffffffffffc4;
  char cVar3;
  undefined4 in_stack_ffffffffffffffc8;
  byte bVar4;
  ImGuiKey in_stack_ffffffffffffffcc;
  int iVar5;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  bool bVar6;
  
  pIVar2 = ImGui_ImplSDL2_GetBackendData();
  this = ImGui::GetIO();
  iVar5 = *in_RDI;
  if (iVar5 == 0x200) {
    cVar3 = (char)in_RDI[3];
    if (cVar3 == '\n') {
      pIVar2->MouseWindowID = in_RDI[2];
      pIVar2->MouseLastLeaveFrame = 0;
    }
    if (cVar3 == '\v') {
      iVar5 = ImGui::GetFrameCount();
      pIVar2->MouseLastLeaveFrame = iVar5 + 1;
    }
    bVar6 = SUB41((uint)in_stack_fffffffffffffffc >> 0x18,0);
    if (cVar3 == '\f') {
      ImGuiIO::AddFocusEvent(unaff_retaddr,bVar6);
    }
    else if ((char)in_RDI[3] == '\r') {
      ImGuiIO::AddFocusEvent(unaff_retaddr,bVar6);
    }
    bVar6 = true;
  }
  else if (iVar5 - 0x300U < 2) {
    ImGui_ImplSDL2_UpdateKeyModifiers(in_stack_ffffffffffffffc4);
    IVar1 = ImGui_ImplSDL2_KeyEventToImGuiKey(in_RDI[5],in_RDI[4]);
    ImGuiIO::AddKeyEvent
              ((ImGuiIO *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,SUB41(IVar1 >> 0x18,0));
    ImGuiIO::SetKeyEventNativeData
              (this,(ImGuiKey)in_stack_ffffffffffffffdc,(int)in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    bVar6 = true;
  }
  else if (iVar5 == 0x303) {
    ImGuiIO::AddInputCharactersUTF8
              ((ImGuiIO *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    bVar6 = true;
  }
  else if (iVar5 == 0x400) {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,(float)in_RDI[5],(float)in_RDI[6]);
    ImGuiIO::AddMouseSourceEvent(this,(uint)(in_RDI[3] == -1));
    ImGuiIO::AddMousePosEvent(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    bVar6 = true;
  }
  else {
    if (iVar5 - 0x401U < 2) {
      iVar5 = -1;
      if ((char)in_RDI[4] == '\x01') {
        iVar5 = 0;
      }
      if ((char)in_RDI[4] == '\x03') {
        iVar5 = 1;
      }
      if ((char)in_RDI[4] == '\x02') {
        iVar5 = 2;
      }
      if ((char)in_RDI[4] == '\x04') {
        iVar5 = 3;
      }
      if ((char)in_RDI[4] == '\x05') {
        iVar5 = 4;
      }
      if (iVar5 != -1) {
        ImGuiIO::AddMouseSourceEvent(this,(uint)(in_RDI[3] == -1));
        bVar4 = (byte)iVar5;
        ImGuiIO::AddMouseButtonEvent(_key,in_stack_0000000c,in_stack_0000000b);
        if (*in_RDI == 0x401) {
          local_44 = pIVar2->MouseButtonsDown | 1 << (bVar4 & 0x1f);
        }
        else {
          local_44 = pIVar2->MouseButtonsDown & (1 << (bVar4 & 0x1f) ^ 0xffffffffU);
        }
        pIVar2->MouseButtonsDown = local_44;
        return true;
      }
    }
    else {
      if (iVar5 == 0x403) {
        ImGuiIO::AddMouseSourceEvent(this,(uint)(in_RDI[3] == -1));
        ImGuiIO::AddMouseWheelEvent(this,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
        return true;
      }
      if (iVar5 - 0x653U < 2) {
        pIVar2->WantUpdateGamepadsList = true;
        return true;
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui_ImplSDL2_ProcessEvent(const SDL_Event* event)
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    IM_ASSERT(bd != nullptr && "Context or backend not initialized! Did you call ImGui_ImplSDL2_Init()?");
    ImGuiIO& io = ImGui::GetIO();

    switch (event->type)
    {
        case SDL_MOUSEMOTION:
        {
            ImVec2 mouse_pos((float)event->motion.x, (float)event->motion.y);
            io.AddMouseSourceEvent(event->motion.which == SDL_TOUCH_MOUSEID ? ImGuiMouseSource_TouchScreen : ImGuiMouseSource_Mouse);
            io.AddMousePosEvent(mouse_pos.x, mouse_pos.y);
            return true;
        }
        case SDL_MOUSEWHEEL:
        {
            //IMGUI_DEBUG_LOG("wheel %.2f %.2f, precise %.2f %.2f\n", (float)event->wheel.x, (float)event->wheel.y, event->wheel.preciseX, event->wheel.preciseY);
#if SDL_VERSION_ATLEAST(2,0,18) // If this fails to compile on Emscripten: update to latest Emscripten!
            float wheel_x = -event->wheel.preciseX;
            float wheel_y = event->wheel.preciseY;
#else
            float wheel_x = -(float)event->wheel.x;
            float wheel_y = (float)event->wheel.y;
#endif
#ifdef __EMSCRIPTEN__
            wheel_x /= 100.0f;
#endif
            io.AddMouseSourceEvent(event->wheel.which == SDL_TOUCH_MOUSEID ? ImGuiMouseSource_TouchScreen : ImGuiMouseSource_Mouse);
            io.AddMouseWheelEvent(wheel_x, wheel_y);
            return true;
        }
        case SDL_MOUSEBUTTONDOWN:
        case SDL_MOUSEBUTTONUP:
        {
            int mouse_button = -1;
            if (event->button.button == SDL_BUTTON_LEFT) { mouse_button = 0; }
            if (event->button.button == SDL_BUTTON_RIGHT) { mouse_button = 1; }
            if (event->button.button == SDL_BUTTON_MIDDLE) { mouse_button = 2; }
            if (event->button.button == SDL_BUTTON_X1) { mouse_button = 3; }
            if (event->button.button == SDL_BUTTON_X2) { mouse_button = 4; }
            if (mouse_button == -1)
                break;
            io.AddMouseSourceEvent(event->button.which == SDL_TOUCH_MOUSEID ? ImGuiMouseSource_TouchScreen : ImGuiMouseSource_Mouse);
            io.AddMouseButtonEvent(mouse_button, (event->type == SDL_MOUSEBUTTONDOWN));
            bd->MouseButtonsDown = (event->type == SDL_MOUSEBUTTONDOWN) ? (bd->MouseButtonsDown | (1 << mouse_button)) : (bd->MouseButtonsDown & ~(1 << mouse_button));
            return true;
        }
        case SDL_TEXTINPUT:
        {
            io.AddInputCharactersUTF8(event->text.text);
            return true;
        }
        case SDL_KEYDOWN:
        case SDL_KEYUP:
        {
            ImGui_ImplSDL2_UpdateKeyModifiers((SDL_Keymod)event->key.keysym.mod);
            ImGuiKey key = ImGui_ImplSDL2_KeyEventToImGuiKey(event->key.keysym.sym, event->key.keysym.scancode);
            io.AddKeyEvent(key, (event->type == SDL_KEYDOWN));
            io.SetKeyEventNativeData(key, event->key.keysym.sym, event->key.keysym.scancode, event->key.keysym.scancode); // To support legacy indexing (<1.87 user code). Legacy backend uses SDLK_*** as indices to IsKeyXXX() functions.
            return true;
        }
        case SDL_WINDOWEVENT:
        {
            // - When capturing mouse, SDL will send a bunch of conflicting LEAVE/ENTER event on every mouse move, but the final ENTER tends to be right.
            // - However we won't get a correct LEAVE event for a captured window.
            // - In some cases, when detaching a window from main viewport SDL may send SDL_WINDOWEVENT_ENTER one frame too late,
            //   causing SDL_WINDOWEVENT_LEAVE on previous frame to interrupt drag operation by clear mouse position. This is why
            //   we delay process the SDL_WINDOWEVENT_LEAVE events by one frame. See issue #5012 for details.
            Uint8 window_event = event->window.event;
            if (window_event == SDL_WINDOWEVENT_ENTER)
            {
                bd->MouseWindowID = event->window.windowID;
                bd->MouseLastLeaveFrame = 0;
            }
            if (window_event == SDL_WINDOWEVENT_LEAVE)
                bd->MouseLastLeaveFrame = ImGui::GetFrameCount() + 1;
            if (window_event == SDL_WINDOWEVENT_FOCUS_GAINED)
                io.AddFocusEvent(true);
            else if (event->window.event == SDL_WINDOWEVENT_FOCUS_LOST)
                io.AddFocusEvent(false);
            return true;
        }
        case SDL_CONTROLLERDEVICEADDED:
        case SDL_CONTROLLERDEVICEREMOVED:
        {
            bd->WantUpdateGamepadsList = true;
            return true;
        }
    }
    return false;
}